

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QStringView_&>,_QLatin1String>
          *this)

{
  QStringView *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  QAbstractConcatenable *this_00;
  QChar *out;
  char16_t *__src;
  qsizetype n;
  QLatin1StringView in;
  QLatin1StringView in_00;
  
  pQVar1 = (this->a).b;
  out = (QChar *)((ulong)(this->a).a.b.m_data | (ulong)(this->a).a.a.d.ptr);
  if ((out == (QChar *)0x0) &&
     (out = (QChar *)((ulong)(this->b).m_data | (ulong)pQVar1->m_data), out == (QChar *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = (this->a).a.b.m_size;
    lVar3 = (this->a).a.a.d.size;
    lVar4 = pQVar1->m_size;
    lVar5 = (this->b).m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar2 + lVar3 + lVar4 + lVar5,Uninitialized);
    pcVar6 = (__return_storage_ptr__->d).ptr;
    lVar2 = (this->a).a.a.d.size;
    if (lVar2 != 0) {
      __src = (this->a).a.a.d.ptr;
      if (__src == (char16_t *)0x0) {
        __src = &QString::_empty;
      }
      memcpy(pcVar6,__src,lVar2 * 2);
    }
    pcVar6 = pcVar6 + lVar2;
    this_00 = (QAbstractConcatenable *)(this->a).a.b.m_size;
    in.m_data = (char *)pcVar6;
    in.m_size = (qsizetype)(this->a).a.b.m_data;
    QAbstractConcatenable::appendLatin1To(this_00,in,out);
    pQVar1 = (this->a).b;
    lVar2 = pQVar1->m_size;
    if (lVar2 != 0) {
      memcpy(pcVar6 + (long)this_00,pQVar1->m_data,lVar2 * 2);
    }
    in_00.m_data = (char *)(pcVar6 + (long)this_00 + lVar2);
    in_00.m_size = (qsizetype)(this->b).m_data;
    QAbstractConcatenable::appendLatin1To((QAbstractConcatenable *)(this->b).m_size,in_00,out);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }